

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildFile::BuildFile
          (BuildFile *this,StringRef mainFilename,BuildFileDelegate *delegate)

{
  BuildFileImpl *this_00;
  BuildFileDelegate *delegate_local;
  BuildFile *this_local;
  StringRef mainFilename_local;
  
  this_00 = (BuildFileImpl *)operator_new(0xd0);
  anon_unknown.dwarf_f615c::BuildFileImpl::BuildFileImpl(this_00,this,mainFilename,delegate);
  this->impl = this_00;
  return;
}

Assistant:

BuildFile::BuildFile(StringRef mainFilename,
                     BuildFileDelegate& delegate)
  : impl(new BuildFileImpl(*this, mainFilename, delegate))
{
}